

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::GetJSFilename
                   (string *__return_storage_ptr__,GeneratorOptions *options,string *filename)

{
  string local_60;
  string local_40;
  string *local_20;
  string *filename_local;
  GeneratorOptions *options_local;
  
  local_20 = filename;
  filename_local = &options->output_dir;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  StripProto(&local_40,filename);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_60,(GeneratorOptions *)filename_local);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string GetJSFilename(const GeneratorOptions& options, const string& filename) {
  return StripProto(filename) + options.GetFileNameExtension();
}